

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aco_solver.cpp
# Opt level: O3

set<int,_std::less<int>,_std::allocator<int>_> *
get_angles(set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,string *file,int n
          )

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  ostream *poVar3;
  long lVar4;
  set<int,_std::less<int>,_std::allocator<int>_> *angles;
  string line;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  q;
  ifstream _file;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *local_2d8;
  int local_2cc;
  char *local_2c8 [2];
  char local_2b8 [16];
  undefined1 *local_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [16];
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  long local_238 [4];
  byte abStack_218 [488];
  
  local_2d8 = &__return_storage_ptr__->_M_t;
  std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
  local_2a8 = local_298;
  local_2a0 = 0;
  local_298[0] = 0;
  lVar4 = *(long *)(local_238[0] + -0x18);
  if ((abStack_218[lVar4] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"ERROR: unable to open instance file: ",0x25);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", stopping! \n",0xd);
    lVar4 = *(long *)(local_238[0] + -0x18);
  }
  cVar2 = std::ios::widen((char)&local_2d8 + (char)lVar4 + -0x60);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_2a8,cVar2);
  std::ifstream::close();
  p_Var1 = &(((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header;
  (((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_color = _S_red;
  (((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (((_Rep_type *)&local_2d8->_M_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_288._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_288,0);
  lVar4 = std::__cxx11::string::find((char)&local_2a8,0x20);
  if (lVar4 != -1) {
    do {
      std::__cxx11::string::substr((ulong)local_2c8,(ulong)&local_2a8);
      local_2cc = atoi(local_2c8[0]);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(local_2d8,&local_2cc);
      if (local_2c8[0] != local_2b8) {
        operator_delete(local_2c8[0]);
      }
      lVar4 = std::__cxx11::string::find((char)&local_2a8,0x20);
    } while (lVar4 != -1);
  }
  std::__cxx11::string::substr((ulong)local_2c8,(ulong)&local_2a8);
  local_2cc = atoi(local_2c8[0]);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
  _M_insert_unique<int>(local_2d8,&local_2cc);
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0]);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_288);
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  std::ifstream::~ifstream(local_238);
  return (set<int,_std::less<int>,_std::allocator<int>_> *)local_2d8;
}

Assistant:

set<int> get_angles(string file, int n){
  ifstream _file(file.c_str(), ios::in);
  string line;

  if (! _file)
    cerr << "ERROR: unable to open instance file: " << file << ", stopping! \n";

  //cout << "##Reading volume files." << endl;
  getline(_file, line);
  _file.close();

  set<int> angles;
  stack<string> q;
  char delim=' ';
  std::size_t current, previous = 0;
  current = line.find(delim);
  //cout << line << endl;
  while (current != std::string::npos) {
    angles.insert(atoi(line.substr(previous, current - previous).c_str()));
    previous = current + 1;
    current = line.find(delim, previous);
  }
  angles.insert(atoi(line.substr(previous, current - previous).c_str()));

  return angles;
}